

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  ImGuiWindowSettings *pIVar3;
  char *pcVar4;
  void *in_RDI;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  ImGuiWindowSettings *in_stack_ffffffffffffffb8;
  ImVector<ImGuiWindowSettings> *this;
  char *in_stack_ffffffffffffffd0;
  
  pIVar1 = GImGui;
  this = &GImGui->SettingsWindows;
  ImGuiWindowSettings::ImGuiWindowSettings((ImGuiWindowSettings *)this);
  ImVector<ImGuiWindowSettings>::push_back(this,in_stack_ffffffffffffffb8);
  pIVar3 = ImVector<ImGuiWindowSettings>::back(&pIVar1->SettingsWindows);
  pcVar4 = ImStrdup(in_stack_ffffffffffffffd0);
  pIVar3->Name = pcVar4;
  IVar2 = ImHash(in_RDI,0,0);
  pIVar3->ID = IVar2;
  return pIVar3;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->ID = ImHash(name, 0);
    return settings;
}